

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

uint32_t ra_portable_header_size(roaring_array_t *ra)

{
  _Bool _Var1;
  roaring_array_t *ra_local;
  
  _Var1 = ra_has_run_container(ra);
  if (_Var1) {
    if (ra->size < 4) {
      ra_local._4_4_ = (ra->size + 7) / 8 + 4 + ra->size * 4;
    }
    else {
      ra_local._4_4_ = (ra->size + 7) / 8 + 4 + ra->size * 8;
    }
  }
  else {
    ra_local._4_4_ = ra->size * 8 + 8;
  }
  return ra_local._4_4_;
}

Assistant:

uint32_t ra_portable_header_size(const roaring_array_t *ra) {
    if (ra_has_run_container(ra)) {
        if (ra->size <
            NO_OFFSET_THRESHOLD) {  // for small bitmaps, we omit the offsets
            return 4 + (ra->size + 7) / 8 + 4 * ra->size;
        }
        return 4 + (ra->size + 7) / 8 +
               8 * ra->size;  // - 4 because we pack the size with the cookie
    } else {
        return 4 + 4 + 8 * ra->size;
    }
}